

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  JSAMPROW pJVar11;
  int iVar12;
  ulong uVar13;
  
  iVar10 = compptr->width_in_blocks * 8;
  iVar5 = cinfo->max_h_samp_factor / compptr->h_samp_factor;
  uVar13 = (long)cinfo->max_v_samp_factor / (long)compptr->v_samp_factor;
  iVar1 = (int)uVar13;
  expand_right_edge(input_data,cinfo->max_v_samp_factor,cinfo->image_width,iVar5 * iVar10);
  lVar4 = 0;
  iVar8 = 0;
  if (0 < iVar5) {
    iVar8 = iVar5;
  }
  uVar9 = 0;
  if (0 < iVar1) {
    uVar9 = uVar13 & 0xffffffff;
  }
  for (lVar7 = 0; lVar7 < compptr->v_samp_factor; lVar7 = lVar7 + 1) {
    pJVar11 = output_data[lVar7];
    uVar13 = 0;
    for (iVar12 = 0; iVar12 != iVar10; iVar12 = iVar12 + 1) {
      lVar2 = 0;
      for (uVar3 = 0; uVar3 != uVar9; uVar3 = uVar3 + 1) {
        for (lVar6 = 0; iVar8 != (int)lVar6; lVar6 = lVar6 + 1) {
          lVar2 = lVar2 + (ulong)input_data[lVar4 + uVar3][lVar6 + uVar13];
        }
      }
      *pJVar11 = (JSAMPLE)((lVar2 + (iVar1 * iVar5) / 2) / (long)(iVar1 * iVar5));
      pJVar11 = pJVar11 + 1;
      uVar13 = (ulong)(uint)((int)uVar13 + iVar5);
    }
    lVar4 = lVar4 + iVar1;
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
               JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;  /* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  JSAMPROW inptr, outptr;
  JLONG outvalue;

  h_expand = cinfo->max_h_samp_factor / compptr->h_samp_factor;
  v_expand = cinfo->max_v_samp_factor / compptr->v_samp_factor;
  numpix = h_expand * v_expand;
  numpix2 = numpix / 2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * h_expand);

  inrow = 0;
  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
         outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
        inptr = input_data[inrow + v] + outcol_h;
        for (h = 0; h < h_expand; h++) {
          outvalue += (JLONG)(*inptr++);
        }
      }
      *outptr++ = (JSAMPLE)((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
  }
}